

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O0

bool __thiscall
QOpenGLTextureBlitterPrivate::ensureProgram(QOpenGLTextureBlitterPrivate *this,ProgramIndex idx)

{
  bool bVar1;
  int iVar2;
  QOpenGLTextureBlitter *this_00;
  uint in_ESI;
  QOpenGLTextureBlitter *in_RDI;
  long in_FS_OFFSET;
  QOpenGLContext *currentContext;
  QSurfaceFormat format;
  pair<int,_int> *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 uVar3;
  QOpenGLTextureBlitter *this_01;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  byte bVar4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  ProgramIndex in_stack_ffffffffffffffe4;
  QOpenGLTextureBlitterPrivate *in_stack_ffffffffffffffe8;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  bVar1 = QScopedPointer::operator_cast_to_bool
                    ((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>
                      *)0x19ca8d);
  if (bVar1) {
    bVar4 = 1;
    goto LAB_0019cc59;
  }
  this_00 = (QOpenGLTextureBlitter *)QOpenGLContext::currentContext();
  if (this_00 == (QOpenGLTextureBlitter *)0x0) {
    bVar4 = 0;
    goto LAB_0019cc59;
  }
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QOpenGLContext::format();
  iVar2 = QSurfaceFormat::profile();
  uVar3 = false;
  if (iVar2 == 1) {
    in_stack_ffffffffffffffe8 = (QOpenGLTextureBlitterPrivate *)QSurfaceFormat::version();
    in_stack_ffffffffffffffdc = 3;
    in_stack_ffffffffffffffd8 = 2;
    std::pair<int,_int>::pair<int,_int,_true>
              ((pair<int,_int> *)&stack0xffffffffffffffe0,(int *)&stack0xffffffffffffffdc,
               (int *)&stack0xffffffffffffffd8);
    uVar3 = std::operator>=((pair<int,_int> *)
                            CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffffa6,
                                                    in_stack_ffffffffffffffa0)),
                            in_stack_ffffffffffffff98);
  }
  if ((bool)uVar3 == false) {
    if (((in_ESI != 2) || (bVar1 = QOpenGLTextureBlitter::supportsRectangleTarget(this_01), !bVar1))
       || (bVar1 = buildProgram(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                                (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ),
                                (char *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0
                                                )), bVar1)) {
      if (((in_ESI != 1) ||
          (bVar1 = QOpenGLTextureBlitter::supportsExternalOESTarget(this_00), !bVar1)) ||
         (bVar1 = buildProgram(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                               ,(char *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0
                                                )), bVar1)) goto LAB_0019cc26;
      bVar4 = 0;
    }
    else {
      bVar4 = 0;
    }
  }
  else if (((in_ESI != 2) ||
           (bVar1 = QOpenGLTextureBlitter::supportsRectangleTarget(this_01), !bVar1)) ||
          (bVar1 = buildProgram(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                                (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ),
                                (char *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0
                                                )), bVar1)) {
LAB_0019cc26:
    bVar1 = QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::
            isNull((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>
                    *)(in_RDI + (ulong)in_ESI * 6 + 3));
    bVar4 = (bVar1 ^ 0xffU) & 1;
  }
  else {
    bVar4 = 0;
  }
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_10);
LAB_0019cc59:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool QOpenGLTextureBlitterPrivate::ensureProgram(ProgramIndex idx)
{
    if (programs[idx].glProgram)
        return true;

    QOpenGLContext *currentContext = QOpenGLContext::currentContext();
    if (!currentContext)
        return false;

    QSurfaceFormat format = currentContext->format();
    if (format.profile() == QSurfaceFormat::CoreProfile && format.version() >= std::pair(3,2)) {
        if (idx == QOpenGLTextureBlitterPrivate::TEXTURE_RECTANGLE && q->supportsRectangleTarget()) {
            if (!buildProgram(idx, vertex_shader150, fragment_shader150_rectangle))
                return false;
        }
    } else {
        if (idx == QOpenGLTextureBlitterPrivate::TEXTURE_RECTANGLE && q->supportsRectangleTarget()) {
            if (!buildProgram(idx, vertex_shader, fragment_shader_rectangle))
                return false;
        }
        if (idx == QOpenGLTextureBlitterPrivate::TEXTURE_EXTERNAL_OES && q->supportsExternalOESTarget()) {
            if (!buildProgram(idx, vertex_shader, fragment_shader_external_oes))
                return false;
        }
    }

    return !programs[idx].glProgram.isNull();
}